

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O2

string * __thiscall
deqp::gls::DrawTestSpec::getName_abi_cxx11_(string *__return_storage_ptr__,DrawTestSpec *this)

{
  pointer pAVar1;
  ulong uVar2;
  string *psVar3;
  ulong uVar4;
  ostream *poVar5;
  Storage storage;
  InputType type;
  OutputType type_00;
  InputType type_01;
  OutputType type_02;
  Usage usage;
  IndexType type_03;
  Storage storage_00;
  size_t ndx;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  uint uVar9;
  string local_210;
  ulong local_1f0;
  ulong local_1e8;
  string *local_1e0;
  string local_1d8;
  stringstream name;
  ostream local_1a8 [376];
  
  local_1f0 = (ulong)(uint)*(uint6 *)((anonymous_namespace)::
                                      getMethodInfo(deqp::gls::DrawTestSpec::DrawMethod)::infos +
                                     (long)(int)this->drawMethod * 6);
  local_1e8 = (ulong)*(uint6 *)((anonymous_namespace)::
                                getMethodInfo(deqp::gls::DrawTestSpec::DrawMethod)::infos +
                               (long)(int)this->drawMethod * 6);
  local_1e0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&name);
  lVar8 = 0;
  uVar6 = 0;
  while( true ) {
    psVar3 = local_1e0;
    uVar2 = local_1e8;
    pAVar1 = (this->attribs).
             super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(this->attribs).
                   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1) / 0x28;
    if (uVar4 <= uVar6) break;
    if (1 < uVar4) {
      poVar5 = std::operator<<(local_1a8,"attrib");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5,"_");
    }
    pcVar7 = "pos_";
    if ((uVar6 != 0) && (pcVar7 = "col_", (&pAVar1->additionalPositionAttribute)[lVar8] != false)) {
      pcVar7 = "pos_";
    }
    std::operator<<(local_1a8,pcVar7);
    if ((&pAVar1->useDefaultAttribute)[lVar8] == true) {
      poVar5 = std::operator<<(local_1a8,"non_array_");
      inputTypeToString_abi_cxx11_
                (&local_1d8,(DrawTestSpec *)(ulong)*(uint *)((long)&pAVar1->inputType + lVar8),type)
      ;
      poVar5 = std::operator<<(poVar5,(string *)&local_1d8);
      poVar5 = std::operator<<(poVar5,"_");
      poVar5 = (ostream *)
               std::ostream::operator<<(poVar5,*(int *)((long)&pAVar1->componentCount + lVar8));
      poVar5 = std::operator<<(poVar5,"_");
      outputTypeToString_abi_cxx11_
                (&local_210,(DrawTestSpec *)(ulong)*(uint *)((long)&pAVar1->outputType + lVar8),
                 type_00);
      poVar5 = std::operator<<(poVar5,(string *)&local_210);
      std::operator<<(poVar5,"_");
    }
    else {
      storageToString_abi_cxx11_
                (&local_1d8,(DrawTestSpec *)(ulong)*(uint *)((long)&pAVar1->storage + lVar8),storage
                );
      poVar5 = std::operator<<(local_1a8,(string *)&local_1d8);
      poVar5 = std::operator<<(poVar5,"_");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(int *)((long)&pAVar1->offset + lVar8));
      poVar5 = std::operator<<(poVar5,"_");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(int *)((long)&pAVar1->stride + lVar8));
      poVar5 = std::operator<<(poVar5,"_");
      inputTypeToString_abi_cxx11_
                (&local_210,(DrawTestSpec *)(ulong)*(uint *)((long)&pAVar1->inputType + lVar8),
                 type_01);
      std::operator<<(poVar5,(string *)&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_1d8);
      if ((*(uint *)((long)&pAVar1->inputType + lVar8) & 0xfffffffe) != 10) {
        std::ostream::operator<<(local_1a8,*(int *)((long)&pAVar1->componentCount + lVar8));
      }
      poVar5 = std::operator<<(local_1a8,"_");
      pcVar7 = "";
      if ((&pAVar1->normalize)[lVar8] != false) {
        pcVar7 = "normalized_";
      }
      poVar5 = std::operator<<(poVar5,pcVar7);
      outputTypeToString_abi_cxx11_
                (&local_1d8,(DrawTestSpec *)(ulong)*(uint *)((long)&pAVar1->outputType + lVar8),
                 type_02);
      poVar5 = std::operator<<(poVar5,(string *)&local_1d8);
      poVar5 = std::operator<<(poVar5,"_");
      usageTypeToString_abi_cxx11_
                (&local_210,(DrawTestSpec *)(ulong)*(uint *)((long)&pAVar1->usage + lVar8),usage);
      poVar5 = std::operator<<(poVar5,(string *)&local_210);
      poVar5 = std::operator<<(poVar5,"_");
      poVar5 = (ostream *)
               std::ostream::operator<<(poVar5,*(int *)((long)&pAVar1->instanceDivisor + lVar8));
      std::operator<<(poVar5,"_");
    }
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1d8);
    uVar6 = uVar6 + 1;
    lVar8 = lVar8 + 0x28;
  }
  if ((local_1f0 & 1) != 0) {
    poVar5 = std::operator<<(local_1a8,"index_");
    indexTypeToString_abi_cxx11_(&local_1d8,(DrawTestSpec *)(ulong)this->indexType,type_03);
    poVar5 = std::operator<<(poVar5,(string *)&local_1d8);
    poVar5 = std::operator<<(poVar5,"_");
    storageToString_abi_cxx11_(&local_210,(DrawTestSpec *)(ulong)this->indexStorage,storage_00);
    poVar5 = std::operator<<(poVar5,(string *)&local_210);
    poVar5 = std::operator<<(poVar5,"_");
    poVar5 = std::operator<<(poVar5,"offset");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->indexPointerOffset);
    std::operator<<(poVar5,"_");
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  uVar9 = (uint)uVar2;
  if ((uVar9 >> 0x18 & 1) != 0) {
    poVar5 = std::operator<<(local_1a8,"first");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->first);
    std::operator<<(poVar5,"_");
  }
  if ((uVar9 >> 0x10 & 1) != 0) {
    poVar5 = std::operator<<(local_1a8,"ranged_");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->indexMin);
    poVar5 = std::operator<<(poVar5,"_");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->indexMax);
    std::operator<<(poVar5,"_");
  }
  if ((uVar9 >> 8 & 1) != 0) {
    poVar5 = std::operator<<(local_1a8,"instances");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->instanceCount);
    std::operator<<(poVar5,"_");
  }
  if ((ulong)this->primitive < 0xb) {
    std::operator<<(local_1a8,&DAT_00a2a878 + *(int *)(&DAT_00a2a878 + (ulong)this->primitive * 4));
  }
  std::ostream::operator<<(local_1a8,this->primitiveCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&name);
  return psVar3;
}

Assistant:

std::string DrawTestSpec::getName (void) const
{
	const MethodInfo	methodInfo	= getMethodInfo(drawMethod);
	const bool			hasFirst	= methodInfo.first;
	const bool			instanced	= methodInfo.instanced;
	const bool			ranged		= methodInfo.ranged;
	const bool			indexed		= methodInfo.indexed;

	std::stringstream name;

	for (size_t ndx = 0; ndx < attribs.size(); ++ndx)
	{
		const AttributeSpec& attrib = attribs[ndx];

		if (attribs.size() > 1)
			name << "attrib" << ndx << "_";

		if (ndx == 0|| attrib.additionalPositionAttribute)
			name << "pos_";
		else
			name << "col_";

		if (attrib.useDefaultAttribute)
		{
			name
				<< "non_array_"
				<< DrawTestSpec::inputTypeToString((DrawTestSpec::InputType)attrib.inputType) << "_"
				<< attrib.componentCount << "_"
				<< DrawTestSpec::outputTypeToString(attrib.outputType) << "_";
		}
		else
		{
			name
				<< DrawTestSpec::storageToString(attrib.storage) << "_"
				<< attrib.offset << "_"
				<< attrib.stride << "_"
				<< DrawTestSpec::inputTypeToString((DrawTestSpec::InputType)attrib.inputType);
			if (attrib.inputType != DrawTestSpec::INPUTTYPE_UNSIGNED_INT_2_10_10_10 && attrib.inputType != DrawTestSpec::INPUTTYPE_INT_2_10_10_10)
				name << attrib.componentCount;
			name
				<< "_"
				<< (attrib.normalize ? "normalized_" : "")
				<< DrawTestSpec::outputTypeToString(attrib.outputType) << "_"
				<< DrawTestSpec::usageTypeToString(attrib.usage) << "_"
				<< attrib.instanceDivisor << "_";
		}
	}

	if (indexed)
		name
			<< "index_" << DrawTestSpec::indexTypeToString(indexType) << "_"
			<< DrawTestSpec::storageToString(indexStorage) << "_"
			<< "offset" << indexPointerOffset << "_";
	if (hasFirst)
		name << "first" << first << "_";
	if (ranged)
		name << "ranged_" << indexMin << "_" << indexMax << "_";
	if (instanced)
		name << "instances" << instanceCount << "_";

	switch (primitive)
	{
		case DrawTestSpec::PRIMITIVE_POINTS:
			name << "points_";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLES:
			name << "triangles_";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLE_FAN:
			name << "triangle_fan_";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP:
			name << "triangle_strip_";
			break;
		case DrawTestSpec::PRIMITIVE_LINES:
			name << "lines_";
			break;
		case DrawTestSpec::PRIMITIVE_LINE_STRIP:
			name << "line_strip_";
			break;
		case DrawTestSpec::PRIMITIVE_LINE_LOOP:
			name << "line_loop_";
			break;
		case DrawTestSpec::PRIMITIVE_LINES_ADJACENCY:
			name << "line_adjancency";
			break;
		case DrawTestSpec::PRIMITIVE_LINE_STRIP_ADJACENCY:
			name << "line_strip_adjancency";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLES_ADJACENCY:
			name << "triangles_adjancency";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP_ADJACENCY:
			name << "triangle_strip_adjancency";
			break;
		default:
			DE_ASSERT(false);
			break;
	}

	name << primitiveCount;

	return name.str();
}